

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

int __thiscall Client::do_recv(Client *this,int fd)

{
  char **ppcVar1;
  ssize_t sVar2;
  uint *puVar3;
  int *piVar4;
  Buff *pBVar5;
  char *pcVar6;
  Buff *pBVar7;
  size_t sVar8;
  Client *pCVar9;
  int iVar10;
  int iVar11;
  Client *pCVar12;
  uint uVar13;
  bool bVar14;
  int local_34;
  
  pCVar9 = (Client *)(ulong)(uint)fd;
  if (this->_sock_fd == fd) {
    pcVar6 = (this->_sock2stdout)._r_pos;
    sVar8 = (long)this + (0x1058 - (long)pcVar6);
    if ((sVar8 == 0) ||
       ((bVar14 = fd == 0, bVar14 &&
        (&(this->_stdin2sock)._r_pos == (char **)(this->_stdin2sock)._r_pos)))) {
      do_recv();
      return -6;
    }
    sVar2 = read(fd,pcVar6,sVar8);
    uVar13 = (uint)sVar2;
LAB_00102031:
    if (-1 < (int)uVar13) {
      if (uVar13 != 0) {
        fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                ,0xc6,"do_recv",pCVar9,uVar13);
        fflush(_stderr);
        if (this->_sock_fd == fd) {
          ppcVar1 = &(this->_sock2stdout)._r_pos;
          *ppcVar1 = *ppcVar1 + (uVar13 & 0x7fffffff);
          return 0;
        }
        if (bVar14) {
          ppcVar1 = &(this->_stdin2sock)._r_pos;
          *ppcVar1 = *ppcVar1 + (uVar13 & 0x7fffffff);
          return 0;
        }
        return 0;
      }
      if (this->_sock_fd == fd) {
        do_recv(this);
        return -1;
      }
      if (!bVar14) {
        return 0;
      }
      do_recv();
      return local_34;
    }
    puVar3 = (uint *)__errno_location();
    pCVar12 = (Client *)(ulong)*puVar3;
    if (*puVar3 == 0xb) {
      return 0;
    }
  }
  else {
    if (fd == 0) {
      pcVar6 = (this->_stdin2sock)._r_pos;
      sVar8 = (long)this + (0x848 - (long)pcVar6);
      if (sVar8 == 0) {
        do_recv();
        return -6;
      }
      sVar2 = read(0,pcVar6,sVar8);
      uVar13 = (uint)sVar2;
      bVar14 = true;
      goto LAB_00102031;
    }
    pCVar12 = pCVar9;
    do_recv(pCVar9);
  }
  do_recv();
  iVar10 = (int)pCVar9;
  pCVar9 = (Client *)((ulong)pCVar9 & 0xffffffff);
  if (iVar10 == 1) {
    pcVar6 = (pCVar12->_sock2stdout)._w_pos;
    sVar8 = (long)(pCVar12->_sock2stdout)._r_pos - (long)pcVar6;
    if (sVar8 == 0) {
LAB_001021b4:
      uVar13 = 0;
      goto LAB_001021b7;
    }
    iVar11 = 1;
  }
  else {
    if (pCVar12->_sock_fd != iVar10) goto LAB_001022a0;
    pcVar6 = (pCVar12->_stdin2sock)._w_pos;
    sVar8 = (long)(pCVar12->_stdin2sock)._r_pos - (long)pcVar6;
    iVar11 = iVar10;
    if (sVar8 == 0) goto LAB_001021b4;
  }
  sVar2 = write(iVar11,pcVar6,sVar8);
  uVar13 = (uint)sVar2;
  if ((int)uVar13 < 0) {
    piVar4 = __errno_location();
    if (*piVar4 == 0xb) {
      return 0;
    }
    do_send();
LAB_001022a0:
    do_send(pCVar9);
    if ((pCVar9->_epoll)._maxevents < iVar10) {
      Epoll::get();
      halt_baddata();
    }
    return iVar10 * 0xc + (int)(pCVar9->_epoll)._events;
  }
LAB_001021b7:
  iVar11 = 0;
  fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbteys: %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
          ,0xf5,"do_send",pCVar9,uVar13);
  fflush(_stderr);
  if (iVar10 == 1) {
    pBVar5 = (Buff *)((pCVar12->_sock2stdout)._w_pos + uVar13);
    (pCVar12->_sock2stdout)._w_pos = (char *)pBVar5;
    pBVar7 = (Buff *)(pCVar12->_sock2stdout)._r_pos;
    if (pBVar7 == pBVar5) {
      pBVar5 = &pCVar12->_sock2stdout;
      (pCVar12->_sock2stdout)._r_pos = pBVar5->_buf;
      (pCVar12->_sock2stdout)._w_pos = pBVar5->_buf;
      pBVar7 = pBVar5;
    }
    if ((pCVar12->_stdineof == true) && (pBVar7 == pBVar5)) {
      shutdown(pCVar12->_sock_fd,0);
      iVar11 = -7;
    }
  }
  else if ((pCVar12->_sock_fd == iVar10) &&
          (pcVar6 = (pCVar12->_stdin2sock)._w_pos + uVar13, (pCVar12->_stdin2sock)._w_pos = pcVar6,
          (pCVar12->_stdin2sock)._r_pos == pcVar6)) {
    (pCVar12->_stdin2sock)._r_pos = (pCVar12->_stdin2sock)._buf;
    (pCVar12->_stdin2sock)._w_pos = (pCVar12->_stdin2sock)._buf;
  }
  return iVar11;
}

Assistant:

int Client::do_recv(int fd)
{
    int nrecv;

    if ((fd == _sock_fd && _sock2stdout.left_size() == 0) ||
        (fd == STDIN_FILENO && _stdin2sock.left_size() == 0))
    {
        if (fd == _sock_fd)
        {
            LOG_PRINT("sock_fd can read, but _sock2stdout have no empty space to read!");
        }
        else if (fd == STDIN_FILENO)
        {
            LOG_PRINT("stdin can read, buf _stdin2sock have no empty space to read!")
        }

        return err_clt_recv_nospace;
    }


    if (fd == _sock_fd)
    {
        nrecv = read(_sock_fd, _sock2stdout._r_pos, _sock2stdout.left_size());
    }
    else if (fd == STDIN_FILENO)
    {
        nrecv = read(STDIN_FILENO, _stdin2sock._r_pos, _stdin2sock.left_size());
    }
    else
    {
        LOG_PRINT("unknown fd: %d", fd);
        exit(err_clt_recv_unknown_fd);
    }

    if (nrecv < 0)
    {
        if (errno != EAGAIN)    //也就是 EWOULDBLOCK
        {
            LOG_PRINT("recv fd:%d occurs error, error %s", fd, strerror(errno));
            exit(err_clt_recv_error);

        }
    }
    else if (nrecv == 0)
    {
        if (fd == _sock_fd)
        {
            LOG_PRINT("read EOF on sock");
            if (_stdineof)
            {
                LOG_PRINT("EOF on sock after EOF on stdin, so disconnect to server[%s:%d]", _svr_ip.c_str(), _svr_port);
                return err_clt_recv_disconn;
            }
            else 
            {
                LOG_PRINT("server[%s:%d] terminated prematurely", _svr_ip.c_str(), _svr_port);
                exit(err_clt_recv_svrcrash);
            }
        }
        else if (fd == STDIN_FILENO)
        {
            LOG_PRINT("read EOF on stdin");
            _stdineof = true;
            if (_stdin2sock.data_size() == 0)
            {
                LOG_PRINT("EOF on stdin and no data to send sock, so shutdown sock write side");
                shutdown(_sock_fd, SHUT_WR);
                return err_clt_recv_shutdown_wr;
            }
        }
    }
    else
    {
        LOG_PRINT("read done from fd: %d, total nbytes: %d", fd, nrecv);
        if (fd == _sock_fd)
        {
            _sock2stdout.set_r_pow(nrecv);
        }
        else if (fd == STDIN_FILENO)
        {
            _stdin2sock.set_r_pow(nrecv);
        }
        return err_clt_recv_normal;
    }
    return err_clt_recv_normal;
}